

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMagCal.cpp
# Opt level: O3

void __thiscall RTIMUMagCal::newMinMaxData(RTIMUMagCal *this,RTVector3 *data)

{
  RTFLOAT *pRVar1;
  int i;
  long lVar2;
  float fVar3;
  
  if (0 < this->m_startCount) {
    this->m_startCount = this->m_startCount + -1;
    return;
  }
  lVar2 = 0;
  do {
    fVar3 = data->m_data[lVar2];
    if (fVar3 < (this->m_magMin).m_data[lVar2]) {
      (this->m_magMin).m_data[lVar2] = fVar3;
      fVar3 = data->m_data[lVar2];
    }
    pRVar1 = (this->m_magMax).m_data + lVar2;
    if (*pRVar1 <= fVar3 && fVar3 != *pRVar1) {
      (this->m_magMax).m_data[lVar2] = fVar3;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return;
}

Assistant:

void RTIMUMagCal::newMinMaxData(const RTVector3& data)
{
    if (m_startCount > 0) {
        m_startCount--;
        return;
    }

    for (int i = 0; i < 3; i++) {
        if (m_magMin.data(i) > data.data(i)) {
            m_magMin.setData(i, data.data(i));
        }

        if (m_magMax.data(i) < data.data(i)) {
            m_magMax.setData(i, data.data(i));
        }
    }
}